

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingReporter.cpp
# Opt level: O1

shared_ptr<ApprovalTests::BlockingReporter> __thiscall
ApprovalTests::BlockingReporter::onMachinesNotNamed(BlockingReporter *this,string *machineName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ApprovalTests::BlockingReporter> sVar3;
  shared_ptr<ApprovalTests::MachineBlocker> machineBlocker;
  shared_ptr<ApprovalTests::MachineBlocker> local_48;
  MachineBlocker local_38;
  
  MachineBlocker::onMachinesNotNamed(&local_38,machineName);
  local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  (local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001d3920
  ;
  local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__MachineBlocker_001d4af0;
  *(_Atomic_word **)
   &local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[1]._M_use_count =
       &local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[2]._M_use_count;
  paVar1 = &local_38.machineName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.machineName._M_dataplus._M_p == paVar1) {
    local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_use_count =
         (int)CONCAT71(local_38.machineName.field_2._M_allocated_capacity._1_7_,
                       local_38.machineName.field_2._M_local_buf[0]);
    local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_weak_count = (int)((uint7)local_38.machineName.field_2._1_7_ >> 0x18);
    local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)local_38.machineName.field_2._8_8_;
  }
  else {
    *(pointer *)
     &local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count = local_38.machineName._M_dataplus._M_p;
    local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_use_count =
         (int)CONCAT71(local_38.machineName.field_2._M_allocated_capacity._1_7_,
                       local_38.machineName.field_2._M_local_buf[0]);
    local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi[2]._M_weak_count = (int)((uint7)local_38.machineName.field_2._1_7_ >> 0x18);
  }
  local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi[2]._vptr__Sp_counted_base = (_func_int **)local_38.machineName._M_string_length;
  local_38.machineName._M_string_length = 0;
  local_38.machineName.field_2._M_local_buf[0] = '\0';
  *(bool *)&local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[3]._M_use_count = local_38.block;
  (this->super_Reporter)._vptr_Reporter = (_func_int **)0x0;
  local_38.machineName._M_dataplus._M_p = (pointer)paVar1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApprovalTests::BlockingReporter,std::allocator<ApprovalTests::BlockingReporter>,std::shared_ptr<ApprovalTests::MachineBlocker>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->blocker,(BlockingReporter **)this,
             (allocator<ApprovalTests::BlockingReporter> *)&local_38,&local_48);
  _Var2._M_pi = extraout_RDX;
  if (local_48.super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<ApprovalTests::MachineBlocker,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<ApprovalTests::BlockingReporter>)
         sVar3.super___shared_ptr<ApprovalTests::BlockingReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockingReporter>
    BlockingReporter::onMachinesNotNamed(const std::string& machineName)
    {
        auto machineBlocker = std::make_shared<MachineBlocker>(
            MachineBlocker::onMachinesNotNamed(machineName));
        return std::make_shared<BlockingReporter>(machineBlocker);
    }